

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O1

bool __thiscall fast_float::bigint::mul(bigint *this,limb y)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  limb lVar6;
  ulong uVar7;
  
  uVar1 = (this->vec).length;
  uVar5 = (ulong)uVar1;
  if (uVar5 == 0) {
    lVar6 = 0;
  }
  else {
    uVar7 = 0;
    lVar6 = 0;
    do {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = lVar6;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = y;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (this->vec).data[uVar7];
      auVar4 = auVar2 * auVar3 + auVar4;
      lVar6 = auVar4._8_8_;
      (this->vec).data[uVar7] = auVar4._0_8_;
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  if (lVar6 != 0) {
    if (0x3d < uVar1) {
      return false;
    }
    (this->vec).data[uVar5] = lVar6;
    (this->vec).length = uVar1 + 1;
  }
  return true;
}

Assistant:

FASTFLOAT_CONSTEXPR20 bool mul(limb y) noexcept {
    return small_mul(vec, y);
  }